

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::~ArrayBuilder
          (ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *this)

{
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *pOVar1;
  RemoveConst<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *pRVar2;
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *pOVar3;
  
  pOVar1 = this->ptr;
  if (pOVar1 != (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0) {
    pRVar2 = this->pos;
    pOVar3 = this->endPtr;
    this->ptr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
    this->pos = (RemoveConst<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_> *)
                0x0;
    this->endPtr = (Orphan<capnp::compiler::Declaration::AnnotationApplication> *)0x0;
    (*(code *)**(undefined8 **)this->disposer)
              (this->disposer,pOVar1,0x20,(long)pRVar2 - (long)pOVar1 >> 5,
               (long)pOVar3 - (long)pOVar1 >> 5,
               ArrayDisposer::
               Dispose_<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>::
               destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }